

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool medit_race(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  RACE_DATA *pRVar1;
  long *bit1;
  long *plVar2;
  const_reference pvVar3;
  char *in_RSI;
  long in_RDI;
  char buf [4608];
  int race;
  MOB_INDEX_DATA *pMob;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  char *in_stack_ffffffffffffedb0;
  char *in_stack_ffffffffffffedd0;
  char local_1228 [4612];
  int local_24;
  long local_20;
  char *local_18;
  long local_10;
  
  local_18 = in_RSI;
  if ((*in_RSI != '\0') &&
     (local_10 = in_RDI, local_24 = race_lookup(in_stack_ffffffffffffedd0), local_24 != -1)) {
    local_20 = *(long *)(*(long *)(local_10 + 0x80) + 0x6c60);
    *(short *)(local_20 + 0x11c) = (short)local_24;
    ch_00 = (CHAR_DATA *)(local_20 + 0xc0);
    pRVar1 = race_data_lookup((int)((ulong)in_stack_ffffffffffffedb0 >> 0x20));
    BITWISE_OR((long *)ch_00,pRVar1->off);
    bit1 = (long *)(local_20 + 0xd0);
    pRVar1 = race_data_lookup((int)((ulong)bit1 >> 0x20));
    BITWISE_OR(bit1,pRVar1->imm);
    plVar2 = (long *)(local_20 + 0xe0);
    pRVar1 = race_data_lookup((int)((ulong)bit1 >> 0x20));
    BITWISE_OR(plVar2,pRVar1->res);
    plVar2 = (long *)(local_20 + 0xf0);
    pRVar1 = race_data_lookup((int)((ulong)bit1 >> 0x20));
    BITWISE_OR(plVar2,pRVar1->vuln);
    plVar2 = (long *)(local_20 + 0x128);
    pRVar1 = race_data_lookup((int)((ulong)bit1 >> 0x20));
    BITWISE_OR(plVar2,pRVar1->form);
    plVar2 = (long *)(local_20 + 0x138);
    pRVar1 = race_data_lookup((int)((ulong)bit1 >> 0x20));
    BITWISE_OR(plVar2,pRVar1->parts);
    send_to_char((char *)bit1,ch_00);
    return true;
  }
  if (*local_18 == '?') {
    send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
    local_24 = 0;
    while (pvVar3 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                              (&race_table,(long)local_24), pvVar3->name != (char *)0x0) {
      if (local_24 % 3 == 0) {
        send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
      }
      pvVar3 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)local_24);
      sprintf(local_1228," %-15s",pvVar3->name);
      send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
      local_24 = local_24 + 1;
    }
    send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  }
  else {
    send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  }
  return false;
}

Assistant:

bool medit_race(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int race;

	if (argument[0] != '\0' && (race = race_lookup(argument)) != -1)
	{
		EDIT_MOB(ch, pMob);

		pMob->race = race;
		BITWISE_OR(pMob->off_flags, race_data_lookup(race)->off);
		BITWISE_OR(pMob->imm_flags, race_data_lookup(race)->imm);
		BITWISE_OR(pMob->res_flags, race_data_lookup(race)->res);
		BITWISE_OR(pMob->vuln_flags, race_data_lookup(race)->vuln);
		BITWISE_OR(pMob->form, race_data_lookup(race)->form);
		BITWISE_OR(pMob->parts, race_data_lookup(race)->parts);

		send_to_char("Race set.\n\r", ch);
		return true;
	}

	if (argument[0] == '?')
	{
		char buf[MAX_STRING_LENGTH];

		send_to_char("Available races are:", ch);

		for (race = 0; race_table[race].name != nullptr; race++)
		{
			if (race % 3 == 0)
				send_to_char("\n\r", ch);

			sprintf(buf, " %-15s", race_table[race].name);
			send_to_char(buf, ch);
		}

		send_to_char("\n\r", ch);
		return false;
	}

	send_to_char("Syntax:  race [race]\n\r"\
				 "Type 'race ?' for a list of races.\n\r", ch);
	return false;
}